

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettify.h
# Opt level: O2

size_t floaxie::fill_exponent<char>(uint K,char *buffer)

{
  char cVar1;
  ulong uVar2;
  
  cVar1 = (char)((ulong)K / 100);
  *buffer = cVar1 + '0';
  uVar2 = (ulong)(cVar1 != '\0');
  *(undefined2 *)(buffer + uVar2) = *(undefined2 *)(digits_lut + ((ulong)K % 100) * 2);
  buffer[uVar2 + 2] = '\0';
  return uVar2 | 2;
}

Assistant:

inline std::size_t fill_exponent(unsigned int K, CharType* buffer) noexcept
	{
		const unsigned char hundreds = static_cast<unsigned char>(K / 100);
		K %= 100;
		buffer[0] = '0' + hundreds;
		buffer += (hundreds > 0);

		const char* d = digits_lut + K * 2;
		buffer[0] = d[0];
		buffer[1] = d[1];

		buffer[2] = '\0';

		return 2 + (hundreds > 0);
	}